

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O1

status_t tchecker::dbm::tighten(db_t *dbm,clock_id_t dim,clock_id_t x,clock_id_t y)

{
  bool bVar1;
  db_t dVar2;
  db_t dVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc0,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0xc1,
                  "enum tchecker::dbm::status_t tchecker::dbm::tighten(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t)"
                 );
  }
  uVar4 = x * dim + y;
  if (dbm[uVar4] != (db_t)0x7ffffffe) {
    uVar5 = 0;
    uVar7 = 0;
    do {
      iVar9 = (int)uVar7;
      if (uVar7 != x) {
        dVar2 = sum(dbm + (x + iVar9 * dim),dbm + uVar4);
        uVar10 = iVar9 * dim + y;
        iVar6 = (int)dbm[uVar10] >> 1;
        bVar1 = (int)dVar2 >> 1 < iVar6;
        if ((int)dVar2 >> 1 == iVar6) {
          bVar1 = ((uint)dVar2 & 1) < ((uint)dbm[uVar10] & 1);
        }
        if (bVar1) {
          dbm[uVar10] = dVar2;
        }
      }
      uVar8 = uVar5;
      uVar11 = (ulong)dim;
      uVar10 = y * dim;
      do {
        dVar3 = sum(dbm + (iVar9 * dim + y),dbm + uVar10);
        dVar2 = dbm[uVar8];
        bVar1 = (int)dVar2 >> 1 < (int)dVar3 >> 1;
        if ((int)dVar2 >> 1 == (int)dVar3 >> 1) {
          bVar1 = ((uint)dVar2 & 1) <= ((uint)dVar3 & 1);
        }
        if (bVar1) {
          dVar3 = dVar2;
        }
        dbm[uVar8] = dVar3;
        uVar10 = uVar10 + 1;
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
      dVar2 = dbm[(dim + 1) * iVar9];
      bVar1 = ((uint)dVar2 & 1) == 0;
      if (1 < (uint)dVar2) {
        bVar1 = (int)dVar2 < 0;
      }
      if (bVar1) {
        *dbm = (db_t)0x0;
        return EMPTY;
      }
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)((int)uVar5 + dim);
    } while (uVar7 != dim);
  }
  return MAY_BE_EMPTY;
}

Assistant:

enum tchecker::dbm::status_t tighten(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::clock_id_t x,
                                     tchecker::clock_id_t y)
{
  assert(dbm != nullptr);
  assert(dim >= 1);

  if (DBM(x, y) == tchecker::dbm::LT_INFINITY)
    return tchecker::dbm::MAY_BE_EMPTY;

  for (tchecker::clock_id_t i = 0; i < dim; ++i) {
    // tighten i->y w.r.t. i->x->y
    if (i != x) {
      tchecker::dbm::db_t db_ixy = tchecker::dbm::sum(DBM(i, x), DBM(x, y));
      if (db_ixy < DBM(i, y))
        DBM(i, y) = db_ixy;
    }

    // tighten i->j w.r.t. i->y->j
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::min(DBM(i, j), tchecker::dbm::sum(DBM(i, y), DBM(y, j)));

    if (DBM(i, i) < tchecker::dbm::LE_ZERO) {
      DBM(0, 0) = tchecker::dbm::LT_ZERO;
      return tchecker::dbm::EMPTY;
    }
  }

  return tchecker::dbm::MAY_BE_EMPTY;
}